

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageDataOperations.h
# Opt level: O1

void fe::operations::SwitchSrcDestT<fe::PixelR8G8B8A8,fe::operations::op_premultipliedAlpha>
               (op_premultipliedAlpha *op,PixelR8G8B8A8 *s,ImageData *src,ImageData *dest)

{
  PixelDISTANCE d_2;
  PixelB8G8R8A8 d_1;
  PixelR8G8B8A8 d_3;
  PixelA8 d;
  PixelDISTANCE local_4;
  PixelB8G8R8A8 local_3;
  PixelR8G8B8A8 local_2;
  PixelA8 local_1;
  
  switch((dest->super_fe_image).format) {
  case FE_IMG_A8:
    applyOperationT<fe::operations::op_premultipliedAlpha,fe::PixelR8G8B8A8,fe::PixelA8>
              (op,s,&local_1,src,dest);
    break;
  default:
    __assert_fail("!\"unknown format\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/frankinshtein[P]font-effects-lib/src/ImageDataOperations.h"
                  ,0x172,
                  "void fe::operations::SwitchSrcDestT(const Op &, const Src &, const ImageData &, const ImageData &) [Src = fe::PixelR8G8B8A8, Op = fe::operations::op_premultipliedAlpha]"
                 );
  case FE_IMG_R8G8B8A8:
    applyOperationT<fe::operations::op_premultipliedAlpha,fe::PixelR8G8B8A8,fe::PixelR8G8B8A8>
              (op,s,&local_2,src,dest);
    break;
  case FE_IMG_B8G8R8A8:
    applyOperationT<fe::operations::op_premultipliedAlpha,fe::PixelR8G8B8A8,fe::PixelB8G8R8A8>
              (op,s,&local_3,src,dest);
    break;
  case FE_IMG_DISTANCE:
    applyOperationT<fe::operations::op_premultipliedAlpha,fe::PixelR8G8B8A8,fe::PixelDISTANCE>
              (op,s,&local_4,src,dest);
  }
  return;
}

Assistant:

void SwitchSrcDestT(const Op& op, const Src& s, const ImageData& src, const ImageData& dest)
        {
#define FORMAT_CASE FORMAT_OP1
            ALL_FORMATS_SWITCH(dest.format);
#undef FORMAT_CASE
        }